

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

Chunk * GetChunk(WebPDemuxer *dmux,char *fourcc,int chunk_num)

{
  uint8_t *header;
  int count;
  Chunk *c;
  uint8_t *mem_buf;
  int chunk_num_local;
  char *fourcc_local;
  WebPDemuxer *dmux_local;
  
  count = 0;
  c = dmux->chunks_;
  while( true ) {
    if (c == (Chunk *)0x0) {
      return (Chunk *)0x0;
    }
    if (*(int *)((dmux->mem_).buf_ + (c->data_).offset_) == *(int *)fourcc) {
      count = count + 1;
    }
    if (count == chunk_num) break;
    c = c->next_;
  }
  return c;
}

Assistant:

static const Chunk* GetChunk(const WebPDemuxer* const dmux,
                             const char fourcc[4], int chunk_num) {
  const uint8_t* const mem_buf = dmux->mem_.buf_;
  const Chunk* c;
  int count = 0;
  for (c = dmux->chunks_; c != NULL; c = c->next_) {
    const uint8_t* const header = mem_buf + c->data_.offset_;
    if (!memcmp(header, fourcc, TAG_SIZE)) ++count;
    if (count == chunk_num) break;
  }
  return c;
}